

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_hexdump(char *dst,void *_src,size_t len)

{
  size_t sVar1;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    dst[sVar1 * 2] = "0123456789abcdef"[*(byte *)((long)_src + sVar1) >> 4];
    dst[sVar1 * 2 + 1] = "0123456789abcdef"[*(byte *)((long)_src + sVar1) & 0xf];
  }
  dst[sVar1 * 2] = '\0';
  return;
}

Assistant:

void ptls_hexdump(char *dst, const void *_src, size_t len)
{
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
}